

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# l2_eval.c
# Opt level: O3

void l2_parse_real_param_list1(l2_scope *scope_p,l2_vector *expr_info_vec_p)

{
  boolean bVar1;
  int pos;
  l2_expr_info expr_info;
  l2_expr_info local_40;
  
  bVar1 = l2_parse_probe_next_token_by_type(L2_TOKEN_COMMA);
  if (bVar1 != '\0') {
    l2_parse_token_forward();
    pos = l2_token_stream_get_pos(g_parser_p->token_stream_p);
    l2_eval_expr_assign(&local_40,scope_p);
    if (local_40.val_type == L2_EXPR_VAL_NOT_EXPR) {
      l2_token_stream_set_pos(g_parser_p->token_stream_p,pos);
    }
    else {
      l2_vector_append(expr_info_vec_p,&local_40);
      l2_parse_real_param_list1(scope_p,expr_info_vec_p);
    }
  }
  return;
}

Assistant:

void l2_parse_real_param_list1(l2_scope *scope_p, l2_vector *expr_info_vec_p) {
    _declr_current_token_p
    _if_type (L2_TOKEN_COMMA)
    {
        int before_eval_pos = l2_token_stream_get_pos(g_parser_p->token_stream_p);
        l2_expr_info expr_info = l2_eval_expr_assign(scope_p);

        _if (expr_info.val_type != L2_EXPR_VAL_NOT_EXPR)
        {
            l2_vector_append(expr_info_vec_p, &expr_info);
            l2_parse_real_param_list1(scope_p, expr_info_vec_p);

        }
        _else
        {
            l2_token_stream_set_pos(g_parser_p->token_stream_p, before_eval_pos);
        }

    } _end
}